

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O0

void __thiscall UtilizationWidget::drawGrid(UtilizationWidget *this)

{
  float fVar1;
  int local_3c;
  float k;
  int i;
  QSize local_28;
  int local_20;
  QSize QStack_1c;
  int graphWidth;
  int local_14;
  UtilizationWidget *pUStack_10;
  int graphHeight;
  UtilizationWidget *this_local;
  
  pUStack_10 = this;
  QStack_1c = QWidget::size(&this->super_QWidget);
  local_14 = QSize::height(&stack0xffffffffffffffe4);
  local_28 = QWidget::size(&this->super_QWidget);
  local_20 = QSize::width(&local_28);
  QColor::QColor((QColor *)&k,100,100,100,0xff);
  QPainter::setPen((QColor *)&this->painter);
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    fVar1 = (float)local_3c / 4.0;
    QPainter::drawLine(&this->painter,(int)((float)local_20 * fVar1),0,
                       (int)((float)local_20 * fVar1),local_14);
    QPainter::drawLine(&this->painter,0,(int)((float)local_14 * fVar1),local_20,
                       (int)((float)local_14 * fVar1));
  }
  return;
}

Assistant:

void UtilizationWidget::drawGrid() {
    const int graphHeight = size().height();
    const int graphWidth = size().width();

    painter.setPen(QColor(100, 100, 100));

    for (int i = 0; i <= 4; ++i) {
        float k = (float) i / 4.0f;
        painter.drawLine(graphWidth * k, 0, graphWidth * k, graphHeight); // vertical
        painter.drawLine(0, graphHeight * k, graphWidth, graphHeight * k); // horizontal
    }
}